

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::COperationsBuilder::AddMatchLeft_W
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TOperationType TVar2;
  bool saveInTable_local;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    TVar2 = OT_MatchLeft_W;
    if (saveInTable) {
      TVar2 = OT_MatchLeftSaveToTable_W;
    }
    addNoArgumensOperation(this,TVar2);
  }
  else {
    TVar2 = OT_MatchLeftWithQualifier_W;
    if (saveInTable) {
      TVar2 = OT_MatchLeftWithQualifierSaveToTable_W;
    }
    addQualifierIndexOperation(this,TVar2,qualifier);
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_W( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchLeftSaveToTable_W : OT_MatchLeft_W ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchLeftWithQualifierSaveToTable_W :
			OT_MatchLeftWithQualifier_W ), qualifier );
	}
}